

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCTas.c
# Opt level: O0

void Tas_ManCancelUntil(Tas_Man_t *p,int iBound)

{
  bool bVar1;
  int local_24;
  Gia_Obj_t *pGStack_20;
  int i;
  Gia_Obj_t *pVar;
  int iBound_local;
  Tas_Man_t *p_local;
  
  if (iBound <= (p->pProp).iTail) {
    (p->pProp).iHead = iBound;
    local_24 = (p->pProp).iHead;
    while( true ) {
      bVar1 = false;
      if (local_24 < (p->pProp).iTail) {
        pGStack_20 = (p->pProp).pData[local_24];
        bVar1 = pGStack_20 != (Gia_Obj_t *)0x0;
      }
      if (!bVar1) break;
      Tas_VarUnassign(pGStack_20);
      local_24 = local_24 + 1;
    }
    (p->pProp).iTail = iBound;
    Vec_IntShrink(p->vLevReas,iBound * 3);
    return;
  }
  __assert_fail("iBound <= p->pProp.iTail",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaCTas.c"
                ,0x277,"void Tas_ManCancelUntil(Tas_Man_t *, int)");
}

Assistant:

static inline void Tas_ManCancelUntil( Tas_Man_t * p, int iBound )
{
    Gia_Obj_t * pVar;
    int i;
    assert( iBound <= p->pProp.iTail );
    p->pProp.iHead = iBound;
    Tas_QueForEachEntry( p->pProp, pVar, i )
        Tas_VarUnassign( pVar );
    p->pProp.iTail = iBound;
    Vec_IntShrink( p->vLevReas, 3*iBound );
}